

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_raw_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_type_raw *pcVar3;
  int iVar4;
  
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar4 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    pcVar3 = coda_type_raw_new(pnVar1->format);
    info->node->data = pcVar3;
    if (pcVar3 != (coda_type_raw *)0x0) {
      iVar2 = handle_name_attribute_for_type(info,attr);
      if (iVar2 == 0) {
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[7] = integer_constant_or_expression_init;
        pnVar1->add_element_to_parent[7] = type_set_bit_size;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x10] = string_data_init;
        pnVar1->add_element_to_parent[0x10] = cd_raw_set_fixed_value;
        info->node->finalise_element = cd_raw_finalise;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cd_raw_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_raw_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_bit_size, integer_constant_or_expression_init, type_set_bit_size);
    register_sub_element(info->node, element_cd_fixed_value, string_data_init, cd_raw_set_fixed_value);
    info->node->finalise_element = cd_raw_finalise;

    return 0;
}